

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qualengine.cpp
# Opt level: O0

int __thiscall QualEngine::init(QualEngine *this,EVP_PKEY_CTX *ctx)

{
  Tank *this_00;
  QualModel *pQVar1;
  bool bVar2;
  int iVar3;
  vector<Node_*,_std::allocator<Node_*>_> *this_01;
  reference ppNVar4;
  long lVar5;
  double dVar6;
  Tank *tank;
  Node *node;
  iterator __end1;
  iterator __begin1;
  vector<Node_*,_std::allocator<Node_*>_> *__range1;
  QualEngine *this_local;
  
  if (this->engineState == OPENED) {
    this_01 = &this->network->nodes;
    __end1 = std::vector<Node_*,_std::allocator<Node_*>_>::begin(this_01);
    node = (Node *)std::vector<Node_*,_std::allocator<Node_*>_>::end(this_01);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                       *)&node), bVar2) {
      ppNVar4 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                ::operator*(&__end1);
      this_00 = (Tank *)*ppNVar4;
      if (this->network->qualModel->type == 2) {
        (this_00->super_Node).quality = 0.0;
      }
      else {
        (this_00->super_Node).quality = (this_00->super_Node).initQual;
      }
      iVar3 = (*(this_00->super_Node).super_Element._vptr_Element[2])();
      if (iVar3 == 1) {
        dVar6 = Tank::findVolume(this_00,this_00->initHead);
        this_00->volume = dVar6;
      }
      __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
      operator++(&__end1);
    }
    (*this->qualSolver->_vptr_QualSolver[2])();
    pQVar1 = this->network->qualModel;
    (*pQVar1->_vptr_QualModel[3])(pQVar1,this->network);
    lVar5 = Network::option(this->network,QUAL_STEP);
    this->qualStep = (int)lVar5;
    if (this->qualStep < 1) {
      this->qualStep = 300;
    }
    this->qualTime = 0;
    this->engineState = INITIALIZED;
  }
  return (int)this;
}

Assistant:

void QualEngine::init()
{
    if (engineState != QualEngine::OPENED) return;

    // ... initialize node concentrations & tank volumes

    for (Node* node : network->nodes)
    {
        if ( network->qualModel->type == QualModel::TRACE ) node->quality = 0.0;
        else node->quality = node->initQual;
        if ( node->type() == Node::TANK )
        {
            Tank* tank = static_cast<Tank*>(node);
            tank->volume = tank->findVolume(tank->initHead);
        }
    }

    // ... initialize reaction model and quality solver

    qualSolver->init();
    network->qualModel->init(network);
    qualStep = network->option(Options::QUAL_STEP);
    if ( qualStep <= 0 ) qualStep = 300;
    qualTime = 0;
    engineState = QualEngine::INITIALIZED;
}